

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_surjectionproof_initialize
              (secp256k1_context *ctx,secp256k1_surjectionproof *proof,size_t *input_index,
              secp256k1_fixed_asset_tag *fixed_input_tags,size_t n_input_tags,
              size_t n_input_tags_to_use,secp256k1_fixed_asset_tag *fixed_output_tag,
              size_t n_max_iterations,uchar *random_seed32)

{
  uchar *puVar1;
  byte *pbVar2;
  uchar *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  uchar *puVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  secp256k1_surjectionproof_csprng csprng;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  long local_a8;
  secp256k1_sha256 local_98;
  
  if (proof == (secp256k1_surjectionproof *)0x0) {
    secp256k1_surjectionproof_initialize_cold_8();
  }
  else if (input_index == (size_t *)0x0) {
    secp256k1_surjectionproof_initialize_cold_7();
  }
  else if (fixed_input_tags == (secp256k1_fixed_asset_tag *)0x0) {
    secp256k1_surjectionproof_initialize_cold_6();
  }
  else if (fixed_output_tag == (secp256k1_fixed_asset_tag *)0x0) {
    secp256k1_surjectionproof_initialize_cold_5();
  }
  else if (random_seed32 == (uchar *)0x0) {
    secp256k1_surjectionproof_initialize_cold_4();
  }
  else if (n_input_tags < 0x101) {
    if (n_input_tags_to_use < 0x101) {
      if (n_input_tags < n_input_tags_to_use) {
        secp256k1_surjectionproof_initialize_cold_1();
      }
      else {
        local_c8 = *(undefined8 *)random_seed32;
        uStack_c0 = *(undefined8 *)(random_seed32 + 8);
        local_b8 = *(undefined8 *)(random_seed32 + 0x10);
        uStack_b0 = *(undefined8 *)(random_seed32 + 0x18);
        local_a8 = 0;
        memset(proof->data,0,0x2020);
        proof->n_inputs = n_input_tags;
        puVar10 = proof->used_inputs;
        lVar11 = 0;
        lVar7 = 0;
        do {
          proof->used_inputs[0x10] = '\0';
          proof->used_inputs[0x11] = '\0';
          proof->used_inputs[0x12] = '\0';
          proof->used_inputs[0x13] = '\0';
          proof->used_inputs[0x14] = '\0';
          proof->used_inputs[0x15] = '\0';
          proof->used_inputs[0x16] = '\0';
          proof->used_inputs[0x17] = '\0';
          proof->used_inputs[0x18] = '\0';
          proof->used_inputs[0x19] = '\0';
          proof->used_inputs[0x1a] = '\0';
          proof->used_inputs[0x1b] = '\0';
          proof->used_inputs[0x1c] = '\0';
          proof->used_inputs[0x1d] = '\0';
          proof->used_inputs[0x1e] = '\0';
          proof->used_inputs[0x1f] = '\0';
          puVar10[0] = '\0';
          puVar10[1] = '\0';
          puVar10[2] = '\0';
          puVar10[3] = '\0';
          puVar10[4] = '\0';
          puVar10[5] = '\0';
          puVar10[6] = '\0';
          puVar10[7] = '\0';
          puVar10[8] = '\0';
          puVar10[9] = '\0';
          puVar10[10] = '\0';
          puVar10[0xb] = '\0';
          puVar10[0xc] = '\0';
          puVar10[0xd] = '\0';
          puVar10[0xe] = '\0';
          puVar10[0xf] = '\0';
          if (n_input_tags_to_use != 0) {
            sVar8 = 0;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = n_input_tags;
            bVar6 = false;
            do {
              do {
                do {
                  if (lVar11 - 0x1fU < 0xffffffffffffffe0) {
                    local_98.s[0] = 0x6a09e667;
                    local_98.s[1] = 0xbb67ae85;
                    local_98.s[2] = 0x3c6ef372;
                    local_98.s[3] = 0xa54ff53a;
                    local_98.s[4] = 0x510e527f;
                    local_98.s[5] = 0x9b05688c;
                    local_98.s[6] = 0x1f83d9ab;
                    local_98.s[7] = 0x5be0cd19;
                    local_98.bytes = 0;
                    secp256k1_sha256_write(&local_98,(uchar *)&local_c8,0x20);
                    secp256k1_sha256_finalize(&local_98,(uchar *)&local_c8);
                    lVar11 = 0;
                  }
                  pbVar2 = (byte *)((long)&local_c8 + lVar11);
                  lVar11 = lVar11 + 1;
                  local_a8 = lVar11;
                } while (0x100U - SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x100)) % auVar4,0) <=
                         (uint)*pbVar2);
                auVar5._8_8_ = 0;
                auVar5._0_8_ = n_input_tags;
                auVar5 = ZEXT116(*pbVar2) % auVar5;
                uVar9 = (ulong)(auVar5._0_4_ << 5);
                puVar1 = fixed_input_tags->data + uVar9;
                puVar3 = fixed_input_tags->data + uVar9 + 0x10;
                auVar13[0] = -(fixed_output_tag->data[0] == *puVar1);
                auVar13[1] = -(fixed_output_tag->data[1] == puVar1[1]);
                auVar13[2] = -(fixed_output_tag->data[2] == puVar1[2]);
                auVar13[3] = -(fixed_output_tag->data[3] == puVar1[3]);
                auVar13[4] = -(fixed_output_tag->data[4] == puVar1[4]);
                auVar13[5] = -(fixed_output_tag->data[5] == puVar1[5]);
                auVar13[6] = -(fixed_output_tag->data[6] == puVar1[6]);
                auVar13[7] = -(fixed_output_tag->data[7] == puVar1[7]);
                auVar13[8] = -(fixed_output_tag->data[8] == puVar1[8]);
                auVar13[9] = -(fixed_output_tag->data[9] == puVar1[9]);
                auVar13[10] = -(fixed_output_tag->data[10] == puVar1[10]);
                auVar13[0xb] = -(fixed_output_tag->data[0xb] == puVar1[0xb]);
                auVar13[0xc] = -(fixed_output_tag->data[0xc] == puVar1[0xc]);
                auVar13[0xd] = -(fixed_output_tag->data[0xd] == puVar1[0xd]);
                auVar13[0xe] = -(fixed_output_tag->data[0xe] == puVar1[0xe]);
                auVar13[0xf] = -(fixed_output_tag->data[0xf] == puVar1[0xf]);
                auVar12[0] = -(fixed_output_tag->data[0x10] == *puVar3);
                auVar12[1] = -(fixed_output_tag->data[0x11] == puVar3[1]);
                auVar12[2] = -(fixed_output_tag->data[0x12] == puVar3[2]);
                auVar12[3] = -(fixed_output_tag->data[0x13] == puVar3[3]);
                auVar12[4] = -(fixed_output_tag->data[0x14] == puVar3[4]);
                auVar12[5] = -(fixed_output_tag->data[0x15] == puVar3[5]);
                auVar12[6] = -(fixed_output_tag->data[0x16] == puVar3[6]);
                auVar12[7] = -(fixed_output_tag->data[0x17] == puVar3[7]);
                auVar12[8] = -(fixed_output_tag->data[0x18] == puVar3[8]);
                auVar12[9] = -(fixed_output_tag->data[0x19] == puVar3[9]);
                auVar12[10] = -(fixed_output_tag->data[0x1a] == puVar3[10]);
                auVar12[0xb] = -(fixed_output_tag->data[0x1b] == puVar3[0xb]);
                auVar12[0xc] = -(fixed_output_tag->data[0x1c] == puVar3[0xc]);
                auVar12[0xd] = -(fixed_output_tag->data[0x1d] == puVar3[0xd]);
                auVar12[0xe] = -(fixed_output_tag->data[0x1e] == puVar3[0xe]);
                auVar12[0xf] = -(fixed_output_tag->data[0x1f] == puVar3[0xf]);
                auVar12 = auVar12 & auVar13;
                if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) {
                  *input_index = auVar5._0_8_;
                  bVar6 = true;
                }
                uVar9 = auVar5._0_8_ >> 3;
              } while ((puVar10[uVar9] >> (auVar5._0_4_ & 7) & 1) != 0);
              puVar10[uVar9] = (byte)(1 << (auVar5[0] & 7)) | puVar10[uVar9];
              sVar8 = sVar8 + 1;
            } while (sVar8 != n_input_tags_to_use);
            if (bVar6) {
              return (int)lVar7 + 1;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != n_max_iterations + (n_max_iterations == 0));
      }
    }
    else {
      secp256k1_surjectionproof_initialize_cold_2();
    }
  }
  else {
    secp256k1_surjectionproof_initialize_cold_3();
  }
  return 0;
}

Assistant:

int secp256k1_surjectionproof_initialize(const secp256k1_context* ctx, secp256k1_surjectionproof* proof, size_t *input_index, const secp256k1_fixed_asset_tag* fixed_input_tags, const size_t n_input_tags, const size_t n_input_tags_to_use, const secp256k1_fixed_asset_tag* fixed_output_tag, const size_t n_max_iterations, const unsigned char *random_seed32) {
    secp256k1_surjectionproof_csprng csprng;
    size_t n_iterations = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(input_index != NULL);
    ARG_CHECK(fixed_input_tags != NULL);
    ARG_CHECK(fixed_output_tag != NULL);
    ARG_CHECK(random_seed32 != NULL);
    ARG_CHECK(n_input_tags <= SECP256K1_SURJECTIONPROOF_MAX_N_INPUTS);
    ARG_CHECK(n_input_tags_to_use <= SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS);
    ARG_CHECK(n_input_tags_to_use <= n_input_tags);
    (void) ctx;

    secp256k1_surjectionproof_csprng_init(&csprng, random_seed32);
    memset(proof->data, 0, sizeof(proof->data));
    proof->n_inputs = n_input_tags;

    while (1) {
        int has_output_tag = 0;
        size_t i;

        /* obtain a random set of indices */
        memset(proof->used_inputs, 0, sizeof(proof->used_inputs));
        for (i = 0; i < n_input_tags_to_use; i++) {
            while (1) {
                size_t next_input_index;
                next_input_index = secp256k1_surjectionproof_csprng_next(&csprng, n_input_tags);
                if (memcmp(&fixed_input_tags[next_input_index], fixed_output_tag, sizeof(*fixed_output_tag)) == 0) {
                    *input_index = next_input_index;
                    has_output_tag = 1;
                }

                if (!(proof->used_inputs[next_input_index / 8] & (1 << (next_input_index  % 8)))) {
                    proof->used_inputs[next_input_index / 8] |= (1 << (next_input_index % 8));
                    break;
                }
            }
        }

        /* Check if we succeeded */
        n_iterations++;
        if (has_output_tag) {
#ifdef VERIFY
            proof->initialized = 1;
#endif
            return n_iterations;
        }
        if (n_iterations >= n_max_iterations) {
#ifdef VERIFY
            proof->initialized = 0;
#endif
            return 0;
        }
    }
}